

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLDriver::setFog
          (COpenGLDriver *this,SColor c,E_FOG_TYPE fogType,f32 start,f32 end,f32 density,
          bool pixelFog,bool rangeFog)

{
  byte in_CL;
  E_FOG_TYPE in_EDX;
  SColor in_ESI;
  CNullDriver *in_RDI;
  byte in_R8B;
  f32 in_XMM0_Da;
  f32 in_XMM1_Da;
  f32 in_XMM2_Da;
  GLfloat data [4];
  SColorf color;
  int local_64;
  undefined1 local_58 [16];
  SColorf *in_stack_ffffffffffffffb8;
  
  CNullDriver::setFog(in_RDI,in_ESI,in_EDX,in_XMM0_Da,in_XMM1_Da,in_XMM2_Da,(bool)(in_CL & 1),
                      (bool)(in_R8B & 1));
  if (in_EDX == EFT_FOG_LINEAR) {
    local_64 = 0x2601;
  }
  else {
    local_64 = 0x801;
    if (in_EDX == EFT_FOG_EXP) {
      local_64 = 0x800;
    }
  }
  glFogf((float)local_64,0xb65);
  if (((ulong)in_RDI[1].HWBufferList.
              super__List_base<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
              ._M_impl._M_node.super__List_node_base._M_prev & 1) != 0) {
    glFogi(0x8450,0x8452);
  }
  if ((*(byte *)((long)in_RDI[1].TransformationMatrix.M + 0x3b) & 1) != 0) {
    if ((bool)(in_R8B & 1) == false) {
      glFogi(0x855a,0x855c);
    }
    else {
      glFogi(0x855a,0x855b);
    }
  }
  if (in_EDX == EFT_FOG_LINEAR) {
    glFogf(in_XMM0_Da,0xb63);
    glFogf(in_XMM1_Da,0xb64);
  }
  else {
    glFogf(in_XMM2_Da,0xb62);
  }
  if ((bool)(in_CL & 1) == false) {
    glHint(0xc54,0x1101);
  }
  else {
    glHint(0xc54,0x1102);
  }
  SColorf::SColorf(in_stack_ffffffffffffffb8,in_ESI);
  glFogfv(0xb66,local_58);
  return;
}

Assistant:

void COpenGLDriver::setFog(SColor c, E_FOG_TYPE fogType, f32 start,
		f32 end, f32 density, bool pixelFog, bool rangeFog)
{
	CNullDriver::setFog(c, fogType, start, end, density, pixelFog, rangeFog);

	glFogf(GL_FOG_MODE, GLfloat((fogType == EFT_FOG_LINEAR) ? GL_LINEAR : (fogType == EFT_FOG_EXP) ? GL_EXP
																								   : GL_EXP2));

#ifdef GL_EXT_fog_coord
	if (FeatureAvailable[IRR_EXT_fog_coord])
		glFogi(GL_FOG_COORDINATE_SOURCE, GL_FRAGMENT_DEPTH);
#endif
#ifdef GL_NV_fog_distance
	if (FeatureAvailable[IRR_NV_fog_distance]) {
		if (rangeFog)
			glFogi(GL_FOG_DISTANCE_MODE_NV, GL_EYE_RADIAL_NV);
		else
			glFogi(GL_FOG_DISTANCE_MODE_NV, GL_EYE_PLANE_ABSOLUTE_NV);
	}
#endif

	if (fogType == EFT_FOG_LINEAR) {
		glFogf(GL_FOG_START, start);
		glFogf(GL_FOG_END, end);
	} else
		glFogf(GL_FOG_DENSITY, density);

	if (pixelFog)
		glHint(GL_FOG_HINT, GL_NICEST);
	else
		glHint(GL_FOG_HINT, GL_FASTEST);

	SColorf color(c);
	GLfloat data[4] = {color.r, color.g, color.b, color.a};
	glFogfv(GL_FOG_COLOR, data);
}